

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_function::preprocess
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  _func_int **pp_Var3;
  pointer pbVar4;
  __type _Var5;
  int iVar6;
  const_reference pptVar7;
  token_base **pptVar8;
  compile_error *pcVar9;
  internal_error *piVar10;
  _func_int **pp_Var11;
  string *name;
  pointer __lhs;
  _func_int **pp_Var12;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  iterator local_48;
  size_t local_40;
  _func_int **local_38;
  
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar7;
  local_88._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
  if (*pptVar8 == (token_base *)0x0) {
    piVar10 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_88,"Null pointer accessed.",(allocator *)&args);
    internal_error::internal_error(piVar10,&local_88);
    __cxa_throw(piVar10,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_88._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
  iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
  if (iVar6 == 3) {
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
    pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
    if (*(int *)&(*pptVar8)[1]._vptr_token_base == 0x27) {
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._M_dataplus._M_p =
           (pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)&args);
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      if (*pptVar8 == (token_base *)0x0) {
        piVar10 = (internal_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_88,"Null pointer accessed.",(allocator *)&args);
        internal_error::internal_error(piVar10,&local_88);
        __cxa_throw(piVar10,&internal_error::typeinfo,internal_error::~internal_error);
      }
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._M_dataplus._M_p =
           (pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)&args);
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
      if (iVar6 != 4) {
        pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "Wrong grammar for function definition, expect function name.",(allocator *)&args
                  );
        compile_error::compile_error(pcVar9,&local_88);
        __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
      }
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._M_dataplus._M_p =
           (pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&args);
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      if (*pptVar8 == (token_base *)0x0) {
        piVar10 = (internal_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_88,"Null pointer accessed.",(allocator *)&args);
        internal_error::internal_error(piVar10,&local_88);
        __cxa_throw(piVar10,&internal_error::typeinfo,internal_error::~internal_error);
      }
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._M_dataplus._M_p =
           (pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&args);
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
      if (iVar6 != 0xd) {
        pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "Wrong grammar for function definition, expect argument list.",(allocator *)&args
                  );
        compile_error::compile_error(pcVar9,&local_88);
        __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
      }
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.mData = (tree_node *)ptVar1[1]._vptr_token_base;
      local_88._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&local_48);
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      ptVar2 = *pptVar8;
      pp_Var11 = ptVar2[2]._vptr_token_base;
      pp_Var12 = ptVar2[3]._vptr_token_base;
      local_40 = ptVar2[3].line_num;
      pp_Var3 = ptVar2[4]._vptr_token_base;
      local_38 = pp_Var12;
      do {
        if (pp_Var11 == pp_Var3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&args);
          return;
        }
        local_88._M_dataplus._M_p = (pointer)*pp_Var11;
        pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
        if (*pptVar8 == (token_base *)0x0) {
          piVar10 = (internal_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_88,"Null pointer accessed.",(allocator *)&local_48);
          internal_error::internal_error(piVar10,&local_88);
          __cxa_throw(piVar10,&internal_error::typeinfo,internal_error::~internal_error);
        }
        compiler_type::try_fix_this_deduction
                  ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->compiler).
                   super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (tree_node *)*pp_Var11);
        local_88._M_dataplus._M_p = (pointer)*pp_Var11;
        pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
        iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
        if (iVar6 == 4) {
          local_88._M_dataplus._M_p = (pointer)*pp_Var11;
          pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
          pbVar4 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          name = (string *)(*pptVar8 + 3);
          __lhs = args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          while (__lhs != pbVar4) {
            _Var5 = std::operator==(__lhs,name);
            __lhs = __lhs + 1;
            if (_Var5) {
              pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_88,"Redefinition of function argument.",
                         (allocator *)&local_48);
              compile_error::compile_error(pcVar9,&local_88);
              __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
            }
          }
          domain_manager::add_record
                    (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage,name);
          pp_Var12 = local_38;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args,name);
        }
        else {
          local_88._M_dataplus._M_p = (pointer)*pp_Var11;
          pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
          iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
          if (iVar6 != 5) {
            pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_88,"Unexpected element in function argument list.",
                       (allocator *)&local_48);
            compile_error::compile_error(pcVar9,&local_88);
            __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
          }
          local_88._M_dataplus._M_p = (pointer)*pp_Var11;
          pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_88,
                       "Redefinition of function argument(Multi-define of vargs).",
                       (allocator *)&local_48);
            compile_error::compile_error(pcVar9,&local_88);
            __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
          }
          ptVar2 = *pptVar8;
          domain_manager::add_record
                    (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage,(string *)(ptVar2 + 1));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args,(string *)(ptVar2 + 1));
        }
        pp_Var11 = pp_Var11 + 1;
        if (pp_Var11 == pp_Var12) {
          pp_Var11 = *(_func_int ***)(local_40 + 8);
          local_40 = local_40 + 8;
          pp_Var12 = pp_Var11 + 0x40;
          local_38 = pp_Var12;
        }
      } while( true );
    }
  }
  pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_88,"Wrong grammar for function definition.",(allocator *)&args);
  compile_error::compile_error(pcVar9,&local_88);
  __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void method_function::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::signal ||
		        static_cast<token_signal *>(t.root().data())->get_signal() != signal_types::fcall_)
			throw compile_error("Wrong grammar for function definition.");
		if (t.root().left().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().left().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for function definition, expect function name.");
		if (t.root().right().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().right().data()->get_type() != token_types::arglist)
			throw compile_error("Wrong grammar for function definition, expect argument list.");
		std::vector<std::string> args;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data() == nullptr)
				throw internal_error("Null pointer accessed.");
			context->compiler->try_fix_this_deduction(it.root());
			if (it.root().data()->get_type() == token_types::id) {
				const std::string &str = static_cast<token_id *>(it.root().data())->get_id();
				for (auto &it: args)
					if (it == str)
						throw compile_error("Redefinition of function argument.");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else if (it.root().data()->get_type() == token_types::vargs) {
				const std::string &str = static_cast<token_vargs *>(it.root().data())->get_id();
				if (!args.empty())
					throw compile_error("Redefinition of function argument(Multi-define of vargs).");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else
				throw compile_error("Unexpected element in function argument list.");
		}
	}